

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

void dispatch_message(skynet_context *ctx,skynet_message *msg)

{
  byte bVar1;
  int iVar2;
  ulong sz;
  
  if (ctx->init == false) {
    __assert_fail("ctx->init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_server.c"
                  ,0xfb,"void dispatch_message(struct skynet_context *, struct skynet_message *)");
  }
  pthread_setspecific(G_NODE.handle_key,(void *)(ulong)ctx->handle);
  sz = msg->sz & 0xffffffffffffff;
  bVar1 = (byte)(msg->sz >> 0x38);
  if (ctx->logfile != (FILE *)0x0) {
    skynet_log_output(ctx->logfile,msg->source,(uint)bVar1,msg->session,msg->data,sz);
  }
  iVar2 = (*ctx->cb)(ctx,ctx->cb_ud,(uint)bVar1,msg->session,msg->source,msg->data,sz);
  if (iVar2 != 0) {
    return;
  }
  free(msg->data);
  return;
}

Assistant:

static void
dispatch_message(struct skynet_context *ctx, struct skynet_message *msg) {
	assert(ctx->init);
	CHECKCALLING_BEGIN(ctx)
	pthread_setspecific(G_NODE.handle_key, (void *)(uintptr_t)(ctx->handle));
	int type = msg->sz >> MESSAGE_TYPE_SHIFT;
	size_t sz = msg->sz & MESSAGE_TYPE_MASK;
	if (ctx->logfile) {
		skynet_log_output(ctx->logfile, msg->source, type, msg->session, msg->data, sz);
	}
	if (!ctx->cb(ctx, ctx->cb_ud, type, msg->session, msg->source, msg->data, sz)) {
		skynet_free(msg->data);
	} 
	CHECKCALLING_END(ctx)
}